

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcdata_varnode.cc
# Opt level: O3

void __thiscall Funcdata::totalReplaceConstant(Funcdata *this,Varnode *vn,uintb val)

{
  PcodeOp *op;
  pointer ppVVar1;
  BlockBasic *bl;
  uint uVar2;
  ulong uVar3;
  Varnode *vn_00;
  Varnode *pVVar4;
  _List_node_base *p_Var5;
  ulong uVar6;
  PcodeOp *local_60;
  Address local_40;
  
  p_Var5 = (vn->descend).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl._M_node.
           super__List_node_base._M_next;
  if (p_Var5 != (_List_node_base *)&vn->descend) {
    local_60 = (PcodeOp *)0x0;
    do {
      op = (PcodeOp *)p_Var5[1]._M_next;
      ppVVar1 = (op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar3 = (ulong)((long)(op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar1) >> 3;
      uVar6 = 0;
      uVar2 = (uint)uVar3;
      if (0 < (int)uVar2) {
        uVar6 = 0;
        do {
          if (ppVVar1[uVar6] == vn) goto LAB_0029de5b;
          uVar6 = uVar6 + 1;
        } while ((uVar2 & 0x7fffffff) != uVar6);
        uVar6 = uVar3 & 0xffffffff;
      }
LAB_0029de5b:
      p_Var5 = p_Var5->_M_next;
      if ((op->flags & 0x40) == 0) {
        vn_00 = newConstant(this,vn->size,val);
      }
      else if (local_60 == (PcodeOp *)0x0) {
        if ((vn->flags & 0x10) == 0) {
          bl = (BlockBasic *)
               *(this->bblocks).list.super__Vector_base<FlowBlock_*,_std::allocator<FlowBlock_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
          (*(bl->super_FlowBlock)._vptr_FlowBlock[2])(&local_40);
          local_60 = newOp(this,1,&local_40);
          opSetOpcode(this,local_60,CPUI_COPY);
          vn_00 = newUniqueOut(this,vn->size,local_60);
          pVVar4 = newConstant(this,vn->size,val);
          opSetInput(this,local_60,pVVar4,0);
          opInsertBegin(this,local_60,bl);
        }
        else {
          local_60 = newOp(this,1,&(vn->def->start).pc);
          opSetOpcode(this,local_60,CPUI_COPY);
          vn_00 = newUniqueOut(this,vn->size,local_60);
          pVVar4 = newConstant(this,vn->size,val);
          opSetInput(this,local_60,pVVar4,0);
          opInsertAfter(this,local_60,vn->def);
        }
      }
      else {
        vn_00 = local_60->output;
      }
      opSetInput(this,op,vn_00,(int4)uVar6);
    } while (p_Var5 != (_List_node_base *)&vn->descend);
  }
  return;
}

Assistant:

void Funcdata::totalReplaceConstant(Varnode *vn,uintb val)

{
  list<PcodeOp *>::const_iterator iter;
  PcodeOp *op;
  PcodeOp *copyop = (PcodeOp *)0;
  Varnode *newrep;
  int4 i;

  iter = vn->beginDescend();
  while(iter != vn->endDescend()) {
    op = *iter++;		// Increment before removing descendant
    i = op->getSlot(vn);
    if (op->isMarker()) {    // Do not put constant directly in marker
      if (copyop == (PcodeOp *)0) {
	if (vn->isWritten()) {
	  copyop = newOp(1,vn->getDef()->getAddr());
	  opSetOpcode(copyop,CPUI_COPY);
	  newrep = newUniqueOut(vn->getSize(),copyop);
	  opSetInput(copyop,newConstant(vn->getSize(),val),0);
	  opInsertAfter(copyop,vn->getDef());
	}
	else {
	  BlockBasic *bb = (BlockBasic *)getBasicBlocks().getBlock(0);
	  copyop = newOp(1,bb->getStart());
	  opSetOpcode(copyop,CPUI_COPY);
	  newrep = newUniqueOut(vn->getSize(),copyop);
	  opSetInput(copyop,newConstant(vn->getSize(),val),0);
	  opInsertBegin(copyop,bb);
	}
      }
      else
	newrep = copyop->getOut();
    }
    else
      newrep = newConstant(vn->getSize(),val);
    opSetInput(op,newrep,i);
  }
}